

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O1

void pobr::utils::Logger::error(string *message,bool *noThrow)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  Exception *this;
  string local_60;
  string local_40;
  
  paVar1 = &local_60.field_2;
  local_60._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"Error","");
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"red","");
  TerminalPrinter::printLabel(&local_60,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  local_60._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"Error","");
  uVar2 = TerminalPrinter::getLabelLength(&local_60);
  local_40._M_dataplus._M_p._0_4_ = uVar2;
  print((uint *)&local_40,message);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  if (*noThrow == true) {
    return;
  }
  this = (Exception *)__cxa_allocate_exception(0x28);
  Exception::Exception(this,message);
  __cxa_throw(this,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

void Logger::error(const std::string& message, const bool& noThrow)
{
    Logger::printLabel("Error", "red");
    Logger::print(Logger::getLabelLength("Error"), message);

    if (noThrow)
    {
        return;
    }

    throw Logger::Exception(message);
}